

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
pybind11::move<std::__cxx11::string>(object *obj)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  handle in_stack_ffffffffffffff18;
  string_caster *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  *this_00;
  str *in_stack_ffffffffffffff48;
  handle in_stack_ffffffffffffff50;
  
  this_00 = in_RDI;
  iVar1 = detail::object_api<pybind11::handle>::ref_count((object_api<pybind11::handle> *)0x10f821);
  if (iVar1 < 2) {
    this = (string_caster *)&stack0xffffffffffffff48;
    detail::load_type<std::__cxx11::string>((handle *)this_00);
    pbVar2 = detail::string_caster::operator_cast_to_string_(this);
    std::__cxx11::string::string((string *)this_00,(string *)pbVar2);
    detail::
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    *)0x10f9d2);
    return in_RDI;
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x10);
  type::handle_of(in_stack_ffffffffffffff18);
  str::str(in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  object::cast<std::__cxx11::string>((object *)in_stack_ffffffffffffff18.m_ptr);
  std::operator+((char *)pbVar2,in_stack_ffffffffffffff20);
  std::operator+(pbVar2,(char *)in_stack_ffffffffffffff20);
  cast_error::runtime_error
            ((cast_error *)in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18.m_ptr);
  __cxa_throw(pbVar2,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
        throw cast_error(
            "Unable to cast Python " + str(type::handle_of(obj)).cast<std::string>()
            + " instance to C++ rvalue: instance has multiple references"
              " (#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python "
                         + str(type::handle_of(obj)).cast<std::string>() + " instance to C++ "
                         + type_id<T>() + " instance: instance has multiple references");
#endif
    }

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T &());
    return ret;
}